

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void remove_unused_and_enumerate_labels(MIR_context_t ctx,MIR_item_t_conflict func_item)

{
  size_t sVar1;
  long i_00;
  MIR_insn_t_conflict pMVar2;
  uint8_t uVar3;
  MIR_insn_t_conflict pMVar4;
  size_t sVar5;
  void *__dest;
  MIR_op_t local_68;
  size_t local_30;
  int64_t label_num;
  MIR_insn_t_conflict label;
  size_t i;
  MIR_item_t_conflict func_item_local;
  MIR_context_t ctx_local;
  
  label = (MIR_insn_t_conflict)0x0;
  i = (size_t)func_item;
  func_item_local = (MIR_item_t_conflict)ctx;
  do {
    pMVar2 = label;
    pMVar4 = (MIR_insn_t_conflict)
             VARR_MIR_insn_tlength(*(VARR_MIR_insn_t **)((long)func_item_local[3].data + 0x18));
    if (pMVar4 <= pMVar2) {
      VARR_MIR_insn_ttrunc(*(VARR_MIR_insn_t **)((long)func_item_local[3].data + 0x18),0);
      return;
    }
    label_num = (int64_t)VARR_MIR_insn_tget(*(VARR_MIR_insn_t **)
                                             ((long)func_item_local[3].data + 0x18),(size_t)label);
    sVar1 = ((MIR_insn_t_conflict)label_num)->ops[0].u.str.len;
    local_30 = sVar1;
    sVar5 = VARR_uint8_tlength((VARR_uint8_t *)(func_item_local->u).func);
    if ((long)sVar1 < (long)sVar5) {
      uVar3 = VARR_uint8_tget((VARR_uint8_t *)(func_item_local->u).func,local_30);
      if (uVar3 == '\0') goto LAB_00129580;
      __dest = (void *)(label_num + 0x20);
      i_00 = *(long *)((long)func_item_local[3].data + 0x38);
      *(long *)((long)func_item_local[3].data + 0x38) = i_00 + 1;
      MIR_new_int_op(&local_68,(MIR_context_t)func_item_local,i_00);
      memcpy(__dest,&local_68,0x30);
    }
    else {
LAB_00129580:
      MIR_remove_insn((MIR_context_t)func_item_local,(MIR_item_t_conflict)i,
                      (MIR_insn_t_conflict)label_num);
    }
    label = (MIR_insn_t_conflict)((long)&label->data + 1);
  } while( true );
}

Assistant:

static void remove_unused_and_enumerate_labels (MIR_context_t ctx, MIR_item_t func_item) {
  for (size_t i = 0; i < VARR_LENGTH (MIR_insn_t, labels); i++) {
    MIR_insn_t label = VARR_GET (MIR_insn_t, labels, i);
    int64_t label_num = label->ops[0].u.i;

    if (label_num < (int64_t) VARR_LENGTH (uint8_t, used_label_p)
        && VARR_GET (uint8_t, used_label_p, label_num)) {
      label->ops[0] = MIR_new_int_op (ctx, new_label_num++);
      continue;
    }
    MIR_remove_insn (ctx, func_item, label);
  }
  VARR_TRUNC (MIR_insn_t, labels, 0);
}